

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  float *pfVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  float fVar6;
  
  uVar1 = (this->IndexLookup).Size;
  uVar5 = (uint)CONCAT62(in_register_00000032,dst);
  if (uVar5 < uVar1) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    bVar3 = src < uVar1;
  }
  else {
    bVar3 = true;
    if (uVar1 <= src) {
      return;
    }
  }
  GrowIndex(this,uVar5 + 1);
  puVar2 = (this->IndexLookup).Data;
  if (bVar3) {
    puVar2[dst] = puVar2[src];
    pfVar4 = (this->IndexAdvanceX).Data;
    fVar6 = pfVar4[src];
  }
  else {
    puVar2[dst] = 0xffff;
    pfVar4 = (this->IndexAdvanceX).Data;
    fVar6 = 1.0;
  }
  pfVar4[dst] = fVar6;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}